

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O1

UBool MBCSAddToUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  byte bVar1;
  ushort uVar2;
  UCMFile *pUVar3;
  uint16_t *puVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  FILE *__stream;
  char cVar11;
  char cVar12;
  undefined7 in_register_00000081;
  ulong uVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  char buffer [10];
  char local_5a [10];
  ulong local_50;
  MBCSData *local_48;
  FILE *local_40;
  char *local_38;
  
  __stream = _stderr;
  uVar9 = CONCAT71(in_register_00000081,flag);
  uVar13 = (ulong)(uint)c;
  pUVar3 = mbcsData->ucm;
  if ((pUVar3->states).countStates == 0) {
    MBCSAddToUnicode();
    return '\0';
  }
  iVar5 = 0;
  uVar15 = 0;
  if (length == 2) {
    uVar15 = (uint)((pUVar3->states).outputType == '\f');
  }
  uVar16 = *(uint *)((long)(pUVar3->states).stateTable[0] +
                    (ulong)*bytes * 4 + (ulong)(uVar15 << 10));
  if (-1 < (int)uVar16) {
    if (length != 1) {
      uVar17 = 1;
      iVar5 = 0;
      do {
        uVar15 = uVar16 >> 0x18;
        iVar5 = (uVar16 & 0xffffff) + iVar5;
        uVar16 = *(uint *)((long)(pUVar3->states).stateTable[0] +
                          (ulong)bytes[uVar17] * 4 + (ulong)(uVar15 << 10));
        if ((int)uVar16 < 0) {
          iVar8 = (int)uVar17 + 1;
          goto LAB_001dc959;
        }
        uVar17 = uVar17 + 1;
      } while ((uint)length != uVar17);
    }
    if (length < 1) {
      pcVar6 = local_5a;
    }
    else {
      iVar5 = length + 1;
      pcVar6 = local_5a;
      do {
        bVar1 = *bytes;
        cVar12 = '0';
        cVar11 = '0';
        if (0x9f < bVar1) {
          cVar11 = 'W';
        }
        *pcVar6 = cVar11 + (bVar1 >> 4);
        if (9 < (bVar1 & 0xf)) {
          cVar12 = 'W';
        }
        pcVar6[1] = cVar12 + (bVar1 & 0xf);
        pcVar6 = pcVar6 + 2;
        bytes = bytes + 1;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    *pcVar6 = '\0';
    pcVar6 = "error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n";
    uVar9 = (ulong)uVar15;
    goto LAB_001dcf4f;
  }
  iVar8 = 1;
  uVar17 = 0;
LAB_001dc959:
  if (length - iVar8 != 0 && iVar8 <= length) {
    if (length < 1) {
      pcVar6 = local_5a;
    }
    else {
      iVar5 = length + 1;
      pcVar6 = local_5a;
      do {
        bVar1 = *bytes;
        cVar12 = '0';
        cVar11 = '0';
        if (0x9f < bVar1) {
          cVar11 = 'W';
        }
        *pcVar6 = cVar11 + (bVar1 >> 4);
        if (9 < (bVar1 & 0xf)) {
          cVar12 = 'W';
        }
        pcVar6[1] = cVar12 + (bVar1 & 0xf);
        pcVar6 = pcVar6 + 2;
        bytes = bytes + 1;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    *pcVar6 = '\0';
    fprintf(_stderr,"error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
            (ulong)(uint)(length - iVar8),(ulong)uVar15,local_5a,uVar13);
    return '\0';
  }
  switch(uVar16 >> 0x14 & 0xf) {
  case 0:
  case 1:
  case 2:
  case 3:
    if ((uVar16 & 0x80ffffff) == 0x8000fffe) {
LAB_001dc9cb:
      uVar10 = c - 0x10000;
      if (c < 0x10000) {
        uVar10 = c;
      }
      *(uint *)((long)(mbcsData->ucm->states).stateTable[0] +
               (ulong)bytes[uVar17] * 4 + (ulong)(uVar15 << 10)) =
           (uint)((char)uVar9 == '\x03') << 0x15 | (uint)(0xffff < c) << 0x14 | uVar16 & 0xff000000
           | uVar10;
      return '\x01';
    }
    uVar10 = uVar16 & 0xfffff;
    if ((uVar16 >> 0x14 & 0xd) != 0) {
      uVar10 = uVar10 + 0x10000;
    }
    if (flag < '\0') {
      if (VERBOSE != '\0') {
        local_40 = _stderr;
        local_50 = uVar13;
        local_48 = mbcsData;
        printBytes(local_5a,bytes,length);
        fprintf(local_40,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",local_50,
                local_5a,(ulong)uVar10);
        uVar9 = uVar9 & 0xffffffff;
        c = (UChar32)local_50;
        mbcsData = local_48;
      }
      goto LAB_001dc9cb;
    }
    local_50 = uVar13;
    printBytes(local_5a,bytes,length);
LAB_001dcf4c:
    pcVar6 = "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
    uVar13 = (ulong)uVar10;
    uVar9 = local_50;
LAB_001dcf4f:
    fprintf(__stream,pcVar6,uVar9,local_5a,uVar13);
    return '\0';
  case 4:
    uVar15 = (uVar16 & 0xffff) + iVar5;
    uVar10 = (uint)mbcsData->unicodeCodeUnits[uVar15];
    local_50 = uVar13;
    if (uVar10 == 0xfffe) {
      uVar9 = uVar9 & 0xffffffff;
      uVar16 = ucm_findFallback(mbcsData->toUFallbacks,mbcsData->countToUFallbacks,uVar15);
      if ((int)uVar16 < 0) {
        uVar10 = 0xffffffff;
      }
      else {
        iVar5 = mbcsData->countToUFallbacks;
        uVar10 = mbcsData->toUFallbacks[uVar16].codePoint;
        mbcsData->toUFallbacks[uVar16].offset = mbcsData->toUFallbacks[(long)iVar5 + -1].offset;
        mbcsData->toUFallbacks[uVar16].codePoint =
             mbcsData->toUFallbacks[(long)iVar5 + -1].codePoint;
        mbcsData->countToUFallbacks = iVar5 + -1;
      }
      cVar12 = (char)uVar9;
      if (uVar10 != 0xffffffff) goto LAB_001dcbc4;
    }
    else {
LAB_001dcbc4:
      __stream = _stderr;
      cVar12 = (char)uVar9;
      if (-1 < cVar12) {
        printBytes(local_5a,bytes,length);
        goto LAB_001dcf4c;
      }
      if (VERBOSE != '\0') {
        local_48 = (MBCSData *)_stderr;
        printBytes(local_5a,bytes,length);
        fprintf((FILE *)local_48,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                local_50,local_5a,(ulong)uVar10);
      }
    }
    uVar13 = local_50;
    __stream = _stderr;
    if ((int)local_50 < 0x10000) {
      if (cVar12 < '\x01') {
        mbcsData->unicodeCodeUnits[uVar15] = (uint16_t)local_50;
        return '\x01';
      }
      if (mbcsData->unicodeCodeUnits[uVar15] != 0xfffe) {
        return '\x01';
      }
      uVar16 = ucm_findFallback(mbcsData->toUFallbacks,mbcsData->countToUFallbacks,uVar15);
      if (-1 < (int)uVar16) {
        mbcsData->toUFallbacks[uVar16].codePoint = (UChar32)local_50;
        return '\x01';
      }
      iVar5 = mbcsData->countToUFallbacks;
      lVar7 = (long)iVar5;
      if (0x1fff < lVar7) {
        fprintf(_stderr,"error: too many toUnicode fallbacks, currently at: U+%x\n");
        return '\0';
      }
      mbcsData->toUFallbacks[lVar7].offset = uVar15;
      mbcsData->toUFallbacks[lVar7].codePoint = (UChar32)local_50;
      mbcsData->countToUFallbacks = iVar5 + 1;
      return '\x01';
    }
    printBytes(local_5a,bytes,length);
    pcVar6 = "error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n";
    break;
  case 5:
    uVar16 = (uVar16 & 0xffff) + iVar5;
    puVar4 = mbcsData->unicodeCodeUnits;
    uVar2 = puVar4[uVar16];
    uVar15 = (uint)uVar2;
    if (0xfffd < uVar15) goto LAB_001dcc78;
    if (0xd7ff < uVar2) {
      if (uVar2 < 0xe000) {
        uVar15 = (uVar2 & 0x3ff) * 0x400 + (puVar4[uVar16 + 1] & 0x3ff) + 0x10000;
      }
      else {
        uVar15 = (uint)puVar4[uVar16 + 1];
      }
    }
    if (flag < '\0') {
      if (VERBOSE != '\0') {
        local_38 = "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
        goto LAB_001dcfd8;
      }
    }
    else {
      local_38 = "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
LAB_001dcfd8:
      local_40 = (FILE *)CONCAT44(local_40._4_4_,(int)uVar9);
      local_50 = uVar13;
      local_48 = mbcsData;
      printBytes(local_5a,bytes,length);
      c = (UChar32)local_50;
      fprintf(__stream,local_38,local_50 & 0xffffffff,local_5a,(ulong)uVar15);
      uVar9 = (ulong)local_40 & 0xffffffff;
      mbcsData = local_48;
    }
    if (-1 < (char)uVar9) {
      return '\0';
    }
LAB_001dcc78:
    uVar14 = (ushort)c;
    if ('\0' < (char)uVar9) {
      if (uVar2 == 0xe000 || uVar2 < 0xdc00) {
        return '\x01';
      }
      if (0xffff < c) {
        puVar4 = mbcsData->unicodeCodeUnits;
        puVar4[uVar16] = (short)((uint)c >> 10) + 0xdbc0;
        puVar4[uVar16 + 1] = uVar14 & 0x3ff | 0xdc00;
        return '\x01';
      }
      puVar4 = mbcsData->unicodeCodeUnits;
      puVar4[uVar16] = 0xe001;
      puVar4[uVar16 + 1] = uVar14;
      return '\x01';
    }
    if (c < 0xd800) {
      mbcsData->unicodeCodeUnits[uVar16] = uVar14;
      return '\x01';
    }
    if (c < 0x10000) {
      puVar4 = mbcsData->unicodeCodeUnits;
      puVar4[uVar16] = 0xe000;
      puVar4[uVar16 + 1] = uVar14;
      return '\x01';
    }
    puVar4 = mbcsData->unicodeCodeUnits;
    puVar4[uVar16] = (short)((uint)c >> 10) + 0xd7c0;
    puVar4[uVar16 + 1] = uVar14 & 0x3ff | 0xdc00;
    return '\x01';
  case 6:
    printBytes(local_5a,bytes,length);
    pcVar6 = "error: byte sequence ends in unassigned state at U+%04x<->0x%s\n";
    break;
  case 7:
    printBytes(local_5a,bytes,length);
    pcVar6 = "error: byte sequence ends in illegal state at U+%04x<->0x%s\n";
    break;
  case 8:
    printBytes(local_5a,bytes,length);
    pcVar6 = "error: byte sequence ends in state-change-only at U+%04x<->0x%s\n";
    break;
  default:
    printBytes(local_5a,bytes,length);
    pcVar6 = 
    "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n";
    uVar9 = (ulong)uVar16;
    goto LAB_001dcf4f;
  }
  fprintf(__stream,pcVar6,uVar13 & 0xffffffff,local_5a);
  return '\0';
}

Assistant:

static UBool
MBCSAddToUnicode(MBCSData *mbcsData,
                 const uint8_t *bytes, int32_t length,
                 UChar32 c,
                 int8_t flag) {
    char buffer[10];
    uint32_t offset=0;
    int32_t i=0, entry, old;
    uint8_t state=0;

    if(mbcsData->ucm->states.countStates==0) {
        fprintf(stderr, "error: there is no state information!\n");
        return FALSE;
    }

    /* for SI/SO (like EBCDIC-stateful), double-byte sequences start in state 1 */
    if(length==2 && mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO) {
        state=1;
    }

    /*
     * Walk down the state table like in conversion,
     * much like getNextUChar().
     * We assume that c<=0x10ffff.
     */
    for(i=0;;) {
        entry=mbcsData->ucm->states.stateTable[state][bytes[i++]];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(i==length) {
                fprintf(stderr, "error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n",
                    (short)state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
        } else {
            if(i<length) {
                fprintf(stderr, "error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
                    (int)(length-i), state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            switch(MBCS_ENTRY_FINAL_ACTION(entry)) {
            case MBCS_STATE_ILLEGAL:
                fprintf(stderr, "error: byte sequence ends in illegal state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_CHANGE_ONLY:
                fprintf(stderr, "error: byte sequence ends in state-change-only at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_UNASSIGNED:
                fprintf(stderr, "error: byte sequence ends in unassigned state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_FALLBACK_DIRECT_16:
            case MBCS_STATE_VALID_DIRECT_16:
            case MBCS_STATE_FALLBACK_DIRECT_20:
            case MBCS_STATE_VALID_DIRECT_20:
                if(MBCS_ENTRY_SET_STATE(entry, 0)!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, 0xfffe)) {
                    /* the "direct" action's value is not "valid-direct-16-unassigned" any more */
                    if(MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_DIRECT_16 || MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_FALLBACK_DIRECT_16) {
                        old=MBCS_ENTRY_FINAL_VALUE(entry);
                    } else {
                        old=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                    /*
                     * Continue after the above warning
                     * if the precision of the mapping is unspecified.
                     */
                }
                /* reassign the correct action code */
                entry=MBCS_ENTRY_FINAL_SET_ACTION(entry, (MBCS_STATE_VALID_DIRECT_16+(flag==3 ? 2 : 0)+(c>=0x10000 ? 1 : 0)));

                /* put the code point into bits 22..7 for BMP, c-0x10000 into 26..7 for others */
                if(c<=0xffff) {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c);
                } else {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c-0x10000);
                }
                mbcsData->ucm->states.stateTable[state][bytes[i-1]]=entry;
                break;
            case MBCS_STATE_VALID_16:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to one 16-bit code unit */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                if((old=mbcsData->unicodeCodeUnits[offset])!=0xfffe || (old=removeFallback(mbcsData, offset))!=-1) {
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                }
                if(c>=0x10000) {
                    fprintf(stderr, "error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n",
                        (int)c, printBytes(buffer, bytes, length));
                    return FALSE;
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(mbcsData->unicodeCodeUnits[offset]==0xfffe) {
                        return setFallback(mbcsData, offset, c);
                    }
                } else {
                    mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                }
                break;
            case MBCS_STATE_VALID_16_PAIR:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to two 16-bit code units */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                old=mbcsData->unicodeCodeUnits[offset];
                if(old<0xfffe) {
                    int32_t real;
                    if(old<0xd800) {
                        real=old;
                    } else if(old<=0xdfff) {
                        real=0x10000+((old&0x3ff)<<10)+((mbcsData->unicodeCodeUnits[offset+1])&0x3ff);
                    } else /* old<=0xe001 */ {
                        real=mbcsData->unicodeCodeUnits[offset+1];
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                    }
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(old<=0xdbff || old==0xe000) {
                        /* do nothing */
                    } else if(c<=0xffff) {
                        /* set a BMP fallback code point as a pair with 0xe001 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe001;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a fallback surrogate pair with two second surrogates */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xdbc0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                } else {
                    if(c<0xd800) {
                        /* set a BMP code point */
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else if(c<=0xffff) {
                        /* set a BMP code point above 0xd800 as a pair with 0xe000 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe000;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a surrogate pair */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xd7c0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                }
                break;
            default:
                /* reserved, must never occur */
                fprintf(stderr, "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n",
                    (int)entry, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }

            return TRUE;
        }
    }
}